

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 (*pauVar65) [16];
  uint uVar66;
  AABBNodeMB4D *node1;
  ulong uVar67;
  long lVar68;
  long lVar69;
  uint uVar70;
  int iVar71;
  long lVar72;
  uint uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  undefined1 (*pauVar83) [16];
  ulong uVar84;
  ulong uVar85;
  long lVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  Geometry *pGVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  float fVar96;
  float fVar103;
  float fVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  float fVar105;
  float fVar106;
  undefined1 auVar107 [16];
  float fVar115;
  float fVar117;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar110 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [32];
  float fVar116;
  float fVar118;
  float fVar119;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar131;
  float fVar132;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar135;
  float fVar137;
  float fVar139;
  undefined1 auVar125 [32];
  float fVar133;
  undefined1 auVar126 [32];
  float fVar134;
  float fVar136;
  float fVar138;
  float fVar140;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar146 [32];
  undefined1 auVar145 [16];
  undefined1 auVar147 [32];
  float fVar151;
  float fVar155;
  undefined1 auVar148 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar164;
  float fVar165;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  float fVar179;
  float fVar180;
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar182 [64];
  float fVar195;
  float fVar196;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [64];
  float fVar209;
  undefined1 auVar210 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [64];
  float fVar218;
  float fVar219;
  undefined1 auVar220 [32];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar221 [64];
  float fVar235;
  undefined1 auVar236 [32];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar237 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  float fVar247;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  undefined1 local_15e0 [16];
  undefined1 local_15d0 [16];
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1530 [16];
  undefined1 local_1520 [8];
  float fStack_1518;
  float fStack_1514;
  undefined1 local_1500 [8];
  float fStack_14f8;
  float fStack_14f4;
  undefined1 local_14e0 [8];
  float fStack_14d8;
  float fStack_14d4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [8];
  float fStack_1338;
  float fStack_1334;
  undefined1 local_1330 [8];
  float fStack_1328;
  float fStack_1324;
  undefined1 local_1320 [8];
  float fStack_1318;
  float fStack_1314;
  undefined1 local_1310 [8];
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar83 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1350._4_4_ = uVar3;
  local_1350._0_4_ = uVar3;
  local_1350._8_4_ = uVar3;
  local_1350._12_4_ = uVar3;
  auVar178 = ZEXT1664(local_1350);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = uVar3;
  local_1360._0_4_ = uVar3;
  local_1360._8_4_ = uVar3;
  local_1360._12_4_ = uVar3;
  auVar182 = ZEXT1664(local_1360);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1370._4_4_ = uVar3;
  local_1370._0_4_ = uVar3;
  local_1370._8_4_ = uVar3;
  local_1370._12_4_ = uVar3;
  auVar200 = ZEXT1664(local_1370);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar118 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar97 = ZEXT416((uint)(fVar106 * 0.99999964));
  local_1380 = vshufps_avx(auVar97,auVar97,0);
  auVar208 = ZEXT1664(local_1380);
  auVar97 = ZEXT416((uint)(fVar116 * 0.99999964));
  local_1390 = vshufps_avx(auVar97,auVar97,0);
  auVar211 = ZEXT1664(local_1390);
  auVar97 = ZEXT416((uint)(fVar118 * 0.99999964));
  local_13a0 = vshufps_avx(auVar97,auVar97,0);
  auVar221 = ZEXT1664(local_13a0);
  auVar97 = ZEXT416((uint)(fVar106 * 1.0000004));
  local_13b0 = vshufps_avx(auVar97,auVar97,0);
  auVar237 = ZEXT1664(local_13b0);
  auVar97 = ZEXT416((uint)(fVar116 * 1.0000004));
  local_13c0 = vshufps_avx(auVar97,auVar97,0);
  auVar246 = ZEXT1664(local_13c0);
  auVar97 = ZEXT416((uint)(fVar118 * 1.0000004));
  local_13d0 = vshufps_avx(auVar97,auVar97,0);
  auVar248 = ZEXT1664(local_13d0);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar93 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar95 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar71 = (tray->tnear).field_0.i[k];
  local_1530._4_4_ = iVar71;
  local_1530._0_4_ = iVar71;
  local_1530._8_4_ = iVar71;
  local_1530._12_4_ = iVar71;
  auVar175 = ZEXT1664(local_1530);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  uVar73 = 1 << ((byte)k & 0x1f);
  iVar71 = (tray->tfar).field_0.i[k];
  auVar102 = ZEXT1664(CONCAT412(iVar71,CONCAT48(iVar71,CONCAT44(iVar71,iVar71))));
  auVar146._8_4_ = 0x3f800000;
  auVar146._0_8_ = 0x3f8000003f800000;
  auVar146._12_4_ = 0x3f800000;
  auVar146._16_4_ = 0x3f800000;
  auVar146._20_4_ = 0x3f800000;
  auVar146._24_4_ = 0x3f800000;
  auVar146._28_4_ = 0x3f800000;
  auVar110._8_4_ = 0xbf800000;
  auVar110._0_8_ = 0xbf800000bf800000;
  auVar110._12_4_ = 0xbf800000;
  auVar110._16_4_ = 0xbf800000;
  auVar110._20_4_ = 0xbf800000;
  auVar110._24_4_ = 0xbf800000;
  auVar110._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar146,auVar110,local_1100);
LAB_00f8b43d:
  do {
    do {
      if (pauVar83 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar65 = pauVar83 + -1;
      pauVar83 = pauVar83 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar65 + 8));
    uVar94 = *(ulong *)*pauVar83;
    while ((uVar94 & 8) == 0) {
      uVar67 = uVar94 & 0xfffffffffffffff0;
      fVar106 = *(float *)(ray + k * 4 + 0xe0);
      auVar107._4_4_ = fVar106;
      auVar107._0_4_ = fVar106;
      auVar107._8_4_ = fVar106;
      auVar107._12_4_ = fVar106;
      pfVar2 = (float *)(uVar67 + 0x80 + uVar75);
      pfVar1 = (float *)(uVar67 + 0x20 + uVar75);
      auVar97._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar97._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar97._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar97._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar97 = vsubps_avx(auVar97,auVar178._0_16_);
      auVar108._0_4_ = auVar208._0_4_ * auVar97._0_4_;
      auVar108._4_4_ = auVar208._4_4_ * auVar97._4_4_;
      auVar108._8_4_ = auVar208._8_4_ * auVar97._8_4_;
      auVar108._12_4_ = auVar208._12_4_ * auVar97._12_4_;
      pfVar2 = (float *)(uVar67 + 0x80 + uVar93);
      auVar97 = vmaxps_avx(auVar175._0_16_,auVar108);
      pfVar1 = (float *)(uVar67 + 0x20 + uVar93);
      auVar142._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar142._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar142._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar142._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar108 = vsubps_avx(auVar142,auVar182._0_16_);
      pfVar2 = (float *)(uVar67 + 0x80 + uVar95);
      pfVar1 = (float *)(uVar67 + 0x20 + uVar95);
      auVar156._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar156._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar156._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar156._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar143._0_4_ = auVar211._0_4_ * auVar108._0_4_;
      auVar143._4_4_ = auVar211._4_4_ * auVar108._4_4_;
      auVar143._8_4_ = auVar211._8_4_ * auVar108._8_4_;
      auVar143._12_4_ = auVar211._12_4_ * auVar108._12_4_;
      auVar108 = vsubps_avx(auVar156,auVar200._0_16_);
      auVar157._0_4_ = auVar221._0_4_ * auVar108._0_4_;
      auVar157._4_4_ = auVar221._4_4_ * auVar108._4_4_;
      auVar157._8_4_ = auVar221._8_4_ * auVar108._8_4_;
      auVar157._12_4_ = auVar221._12_4_ * auVar108._12_4_;
      auVar108 = vmaxps_avx(auVar143,auVar157);
      pfVar2 = (float *)(uVar67 + 0x80 + (uVar75 ^ 0x10));
      pfVar1 = (float *)(uVar67 + 0x20 + (uVar75 ^ 0x10));
      auVar158._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar158._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar158._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar158._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar97 = vmaxps_avx(auVar97,auVar108);
      auVar108 = vsubps_avx(auVar158,auVar178._0_16_);
      auVar144._0_4_ = auVar237._0_4_ * auVar108._0_4_;
      auVar144._4_4_ = auVar237._4_4_ * auVar108._4_4_;
      auVar144._8_4_ = auVar237._8_4_ * auVar108._8_4_;
      auVar144._12_4_ = auVar237._12_4_ * auVar108._12_4_;
      auVar108 = vminps_avx(auVar102._0_16_,auVar144);
      pfVar2 = (float *)(uVar67 + 0x80 + (uVar93 ^ 0x10));
      pfVar1 = (float *)(uVar67 + 0x20 + (uVar93 ^ 0x10));
      auVar159._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar159._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar159._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar159._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar142 = vsubps_avx(auVar159,auVar182._0_16_);
      auVar160._0_4_ = auVar246._0_4_ * auVar142._0_4_;
      auVar160._4_4_ = auVar246._4_4_ * auVar142._4_4_;
      auVar160._8_4_ = auVar246._8_4_ * auVar142._8_4_;
      auVar160._12_4_ = auVar246._12_4_ * auVar142._12_4_;
      pfVar2 = (float *)(uVar67 + 0x80 + (uVar95 ^ 0x10));
      pfVar1 = (float *)(uVar67 + 0x20 + (uVar95 ^ 0x10));
      auVar166._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar166._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar166._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar166._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar142 = vsubps_avx(auVar166,auVar200._0_16_);
      auVar167._0_4_ = auVar248._0_4_ * auVar142._0_4_;
      auVar167._4_4_ = auVar248._4_4_ * auVar142._4_4_;
      auVar167._8_4_ = auVar248._8_4_ * auVar142._8_4_;
      auVar167._12_4_ = auVar248._12_4_ * auVar142._12_4_;
      auVar142 = vminps_avx(auVar160,auVar167);
      auVar108 = vminps_avx(auVar108,auVar142);
      if (((uint)uVar94 & 7) == 6) {
        auVar142 = vcmpps_avx(auVar97,auVar108,2);
        auVar108 = vcmpps_avx(*(undefined1 (*) [16])(uVar67 + 0xe0),auVar107,2);
        auVar107 = vcmpps_avx(auVar107,*(undefined1 (*) [16])(uVar67 + 0xf0),1);
        auVar108 = vandps_avx(auVar108,auVar107);
        auVar108 = vandps_avx(auVar108,auVar142);
      }
      else {
        auVar108 = vcmpps_avx(auVar97,auVar108,2);
      }
      auVar108 = vpslld_avx(auVar108,0x1f);
      uVar70 = vmovmskps_avx(auVar108);
      local_12e0._0_16_ = auVar97;
      if (uVar70 == 0) goto LAB_00f8b43d;
      uVar70 = uVar70 & 0xff;
      lVar69 = 0;
      if (uVar70 != 0) {
        for (; (uVar70 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
        }
      }
      uVar94 = *(ulong *)(uVar67 + lVar69 * 8);
      uVar70 = uVar70 - 1 & uVar70;
      if (uVar70 != 0) {
        uVar66 = *(uint *)(local_12e0 + lVar69 * 4);
        lVar69 = 0;
        if (uVar70 != 0) {
          for (; (uVar70 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
          }
        }
        uVar74 = *(ulong *)(uVar67 + lVar69 * 8);
        uVar5 = *(uint *)(local_12e0 + lVar69 * 4);
        uVar70 = uVar70 - 1 & uVar70;
        if (uVar70 == 0) {
          if (uVar66 < uVar5) {
            *(ulong *)*pauVar83 = uVar74;
            *(uint *)(*pauVar83 + 8) = uVar5;
            pauVar83 = pauVar83 + 1;
          }
          else {
            *(ulong *)*pauVar83 = uVar94;
            *(uint *)(*pauVar83 + 8) = uVar66;
            pauVar83 = pauVar83 + 1;
            uVar94 = uVar74;
          }
        }
        else {
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar94;
          auVar97 = vpunpcklqdq_avx(auVar109,ZEXT416(uVar66));
          auVar123._8_8_ = 0;
          auVar123._0_8_ = uVar74;
          auVar108 = vpunpcklqdq_avx(auVar123,ZEXT416(uVar5));
          lVar69 = 0;
          if (uVar70 != 0) {
            for (; (uVar70 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
            }
          }
          auVar145._8_8_ = 0;
          auVar145._0_8_ = *(ulong *)(uVar67 + lVar69 * 8);
          auVar107 = vpunpcklqdq_avx(auVar145,ZEXT416(*(uint *)(local_12e0 + lVar69 * 4)));
          auVar142 = vpcmpgtd_avx(auVar108,auVar97);
          uVar70 = uVar70 - 1 & uVar70;
          if (uVar70 == 0) {
            auVar143 = vpshufd_avx(auVar142,0xaa);
            auVar142 = vblendvps_avx(auVar108,auVar97,auVar143);
            auVar97 = vblendvps_avx(auVar97,auVar108,auVar143);
            auVar108 = vpcmpgtd_avx(auVar107,auVar142);
            auVar143 = vpshufd_avx(auVar108,0xaa);
            auVar108 = vblendvps_avx(auVar107,auVar142,auVar143);
            auVar142 = vblendvps_avx(auVar142,auVar107,auVar143);
            auVar107 = vpcmpgtd_avx(auVar142,auVar97);
            auVar143 = vpshufd_avx(auVar107,0xaa);
            auVar107 = vblendvps_avx(auVar142,auVar97,auVar143);
            auVar97 = vblendvps_avx(auVar97,auVar142,auVar143);
            *pauVar83 = auVar97;
            pauVar83[1] = auVar107;
            uVar94 = auVar108._0_8_;
            pauVar83 = pauVar83 + 2;
          }
          else {
            lVar69 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> lVar69 & 1) == 0; lVar69 = lVar69 + 1) {
              }
            }
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(uVar67 + lVar69 * 8);
            auVar144 = vpunpcklqdq_avx(auVar168,ZEXT416(*(uint *)(local_12e0 + lVar69 * 4)));
            auVar143 = vpshufd_avx(auVar142,0xaa);
            auVar142 = vblendvps_avx(auVar108,auVar97,auVar143);
            auVar97 = vblendvps_avx(auVar97,auVar108,auVar143);
            auVar108 = vpcmpgtd_avx(auVar144,auVar107);
            auVar143 = vpshufd_avx(auVar108,0xaa);
            auVar108 = vblendvps_avx(auVar144,auVar107,auVar143);
            auVar107 = vblendvps_avx(auVar107,auVar144,auVar143);
            auVar143 = vpcmpgtd_avx(auVar107,auVar97);
            auVar144 = vpshufd_avx(auVar143,0xaa);
            auVar143 = vblendvps_avx(auVar107,auVar97,auVar144);
            auVar97 = vblendvps_avx(auVar97,auVar107,auVar144);
            auVar107 = vpcmpgtd_avx(auVar108,auVar142);
            auVar144 = vpshufd_avx(auVar107,0xaa);
            auVar107 = vblendvps_avx(auVar108,auVar142,auVar144);
            auVar108 = vblendvps_avx(auVar142,auVar108,auVar144);
            auVar142 = vpcmpgtd_avx(auVar143,auVar108);
            auVar144 = vpshufd_avx(auVar142,0xaa);
            auVar142 = vblendvps_avx(auVar143,auVar108,auVar144);
            auVar108 = vblendvps_avx(auVar108,auVar143,auVar144);
            *pauVar83 = auVar97;
            pauVar83[1] = auVar108;
            pauVar83[2] = auVar142;
            auVar175 = ZEXT1664(local_1530);
            uVar94 = auVar107._0_8_;
            pauVar83 = pauVar83 + 3;
          }
        }
      }
    }
    uVar67 = uVar94 & 0xfffffffffffffff0;
    for (lVar69 = 0; lVar69 != (ulong)((uint)uVar94 & 0xf) - 8; lVar69 = lVar69 + 1) {
      lVar68 = lVar69 * 0x60;
      pSVar6 = context->scene;
      pRVar7 = (pSVar6->geometries).items;
      pGVar92 = pRVar7[*(uint *)(uVar67 + 0x40 + lVar68)].ptr;
      fVar106 = (pGVar92->time_range).lower;
      fVar106 = pGVar92->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar106) /
                ((pGVar92->time_range).upper - fVar106));
      auVar97 = vroundss_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),9);
      auVar97 = vminss_avx(auVar97,ZEXT416((uint)(pGVar92->fnumTimeSegments + -1.0)));
      auVar167 = vmaxss_avx(ZEXT816(0) << 0x20,auVar97);
      iVar71 = (int)auVar167._0_4_;
      lVar86 = (long)iVar71 * 0x38;
      lVar8 = *(long *)(*(long *)&pGVar92[2].numPrimitives + lVar86);
      uVar88 = (ulong)*(uint *)(uVar67 + 4 + lVar68);
      auVar97 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar67 + lVar68) * 4);
      uVar76 = (ulong)*(uint *)(uVar67 + 0x10 + lVar68);
      auVar108 = *(undefined1 (*) [16])(lVar8 + uVar76 * 4);
      uVar77 = (ulong)*(uint *)(uVar67 + 0x20 + lVar68);
      auVar142 = *(undefined1 (*) [16])(lVar8 + uVar77 * 4);
      uVar78 = (ulong)*(uint *)(uVar67 + 0x30 + lVar68);
      auVar107 = *(undefined1 (*) [16])(lVar8 + uVar78 * 4);
      lVar8 = *(long *)&pRVar7[*(uint *)(uVar67 + 0x44 + lVar68)].ptr[2].numPrimitives;
      lVar9 = *(long *)(lVar8 + lVar86);
      auVar143 = *(undefined1 (*) [16])(lVar9 + uVar88 * 4);
      uVar79 = (ulong)*(uint *)(uVar67 + 0x14 + lVar68);
      auVar144 = *(undefined1 (*) [16])(lVar9 + uVar79 * 4);
      uVar80 = (ulong)*(uint *)(uVar67 + 0x24 + lVar68);
      auVar156 = *(undefined1 (*) [16])(lVar9 + uVar80 * 4);
      uVar81 = (ulong)*(uint *)(uVar67 + 0x34 + lVar68);
      auVar157 = *(undefined1 (*) [16])(lVar9 + uVar81 * 4);
      lVar9 = *(long *)&pRVar7[*(uint *)(uVar67 + 0x48 + lVar68)].ptr[2].numPrimitives;
      lVar10 = *(long *)(lVar9 + lVar86);
      uVar82 = (ulong)*(uint *)(uVar67 + 8 + lVar68);
      auVar158 = *(undefined1 (*) [16])(lVar10 + uVar82 * 4);
      uVar89 = (ulong)*(uint *)(uVar67 + 0x18 + lVar68);
      auVar159 = *(undefined1 (*) [16])(lVar10 + uVar89 * 4);
      uVar90 = (ulong)*(uint *)(uVar67 + 0x28 + lVar68);
      auVar160 = *(undefined1 (*) [16])(lVar10 + uVar90 * 4);
      uVar91 = (ulong)*(uint *)(uVar67 + 0x38 + lVar68);
      auVar166 = *(undefined1 (*) [16])(lVar10 + uVar91 * 4);
      fVar106 = fVar106 - auVar167._0_4_;
      lVar10 = *(long *)&pRVar7[*(uint *)(uVar67 + 0x4c + lVar68)].ptr[2].numPrimitives;
      lVar86 = *(long *)(lVar10 + lVar86);
      uVar74 = (ulong)*(uint *)(uVar67 + 0xc + lVar68);
      auVar167 = *(undefined1 (*) [16])(lVar86 + uVar74 * 4);
      uVar84 = (ulong)*(uint *)(uVar67 + 0x1c + lVar68);
      auVar109 = *(undefined1 (*) [16])(lVar86 + uVar84 * 4);
      auVar123 = vunpcklps_avx(auVar97,auVar158);
      auVar158 = vunpckhps_avx(auVar97,auVar158);
      auVar145 = vunpcklps_avx(auVar143,auVar167);
      auVar143 = vunpckhps_avx(auVar143,auVar167);
      uVar87 = (ulong)*(uint *)(uVar67 + 0x2c + lVar68);
      auVar97 = *(undefined1 (*) [16])(lVar86 + uVar87 * 4);
      auVar167 = vunpcklps_avx(auVar158,auVar143);
      _local_1310 = vunpcklps_avx(auVar123,auVar145);
      auVar143 = vunpckhps_avx(auVar123,auVar145);
      auVar123 = vunpcklps_avx(auVar108,auVar159);
      auVar158 = vunpckhps_avx(auVar108,auVar159);
      auVar159 = vunpcklps_avx(auVar144,auVar109);
      auVar144 = vunpckhps_avx(auVar144,auVar109);
      uVar85 = (ulong)*(uint *)(uVar67 + 0x3c + lVar68);
      auVar108 = *(undefined1 (*) [16])(lVar86 + uVar85 * 4);
      auVar158 = vunpcklps_avx(auVar158,auVar144);
      auVar109 = vunpcklps_avx(auVar123,auVar159);
      auVar144 = vunpckhps_avx(auVar123,auVar159);
      auVar159 = vunpcklps_avx(auVar142,auVar160);
      auVar142 = vunpckhps_avx(auVar142,auVar160);
      auVar160 = vunpcklps_avx(auVar156,auVar97);
      auVar156 = vunpckhps_avx(auVar156,auVar97);
      lVar72 = (long)(iVar71 + 1) * 0x38;
      lVar86 = *(long *)(*(long *)&pGVar92[2].numPrimitives + lVar72);
      auVar97 = *(undefined1 (*) [16])(lVar86 + (ulong)*(uint *)(uVar67 + lVar68) * 4);
      auVar123 = vunpcklps_avx(auVar142,auVar156);
      _local_1340 = vunpcklps_avx(auVar159,auVar160);
      _local_1330 = vunpckhps_avx(auVar159,auVar160);
      auVar156 = vunpcklps_avx(auVar107,auVar166);
      auVar142 = vunpckhps_avx(auVar107,auVar166);
      auVar159 = vunpcklps_avx(auVar157,auVar108);
      auVar107 = vunpckhps_avx(auVar157,auVar108);
      lVar9 = *(long *)(lVar9 + lVar72);
      auVar108 = *(undefined1 (*) [16])(lVar9 + uVar82 * 4);
      auVar160 = vunpcklps_avx(auVar142,auVar107);
      auVar166 = vunpcklps_avx(auVar156,auVar159);
      _local_1320 = vunpckhps_avx(auVar156,auVar159);
      lVar8 = *(long *)(lVar8 + lVar72);
      auVar107 = vunpcklps_avx(auVar97,auVar108);
      auVar142 = vunpckhps_avx(auVar97,auVar108);
      auVar97 = *(undefined1 (*) [16])(lVar8 + uVar88 * 4);
      lVar10 = *(long *)(lVar10 + lVar72);
      auVar108 = *(undefined1 (*) [16])(lVar10 + uVar74 * 4);
      auVar156 = vunpcklps_avx(auVar97,auVar108);
      auVar97 = vunpckhps_avx(auVar97,auVar108);
      auVar159 = vunpcklps_avx(auVar142,auVar97);
      auVar145 = vunpcklps_avx(auVar107,auVar156);
      auVar142 = vunpckhps_avx(auVar107,auVar156);
      auVar97 = *(undefined1 (*) [16])(lVar86 + uVar76 * 4);
      auVar108 = *(undefined1 (*) [16])(lVar9 + uVar89 * 4);
      auVar156 = vunpcklps_avx(auVar97,auVar108);
      auVar107 = vunpckhps_avx(auVar97,auVar108);
      auVar97 = *(undefined1 (*) [16])(lVar8 + uVar79 * 4);
      auVar108 = *(undefined1 (*) [16])(lVar10 + uVar84 * 4);
      auVar157 = vunpcklps_avx(auVar97,auVar108);
      auVar97 = vunpckhps_avx(auVar97,auVar108);
      auVar168 = vunpcklps_avx(auVar107,auVar97);
      auVar98 = vunpcklps_avx(auVar156,auVar157);
      auVar107 = vunpckhps_avx(auVar156,auVar157);
      auVar97 = *(undefined1 (*) [16])(lVar86 + uVar77 * 4);
      auVar108 = *(undefined1 (*) [16])(lVar9 + uVar90 * 4);
      auVar157 = vunpcklps_avx(auVar97,auVar108);
      auVar156 = vunpckhps_avx(auVar97,auVar108);
      auVar97 = *(undefined1 (*) [16])(lVar8 + uVar80 * 4);
      auVar108 = *(undefined1 (*) [16])(lVar10 + uVar87 * 4);
      auVar124 = vunpcklps_avx(auVar97,auVar108);
      auVar97 = vunpckhps_avx(auVar97,auVar108);
      auVar161 = vunpcklps_avx(auVar156,auVar97);
      auVar169 = vunpcklps_avx(auVar157,auVar124);
      auVar156 = vunpckhps_avx(auVar157,auVar124);
      auVar97 = *(undefined1 (*) [16])(lVar86 + uVar78 * 4);
      auVar108 = *(undefined1 (*) [16])(lVar9 + uVar91 * 4);
      auVar124 = vunpcklps_avx(auVar97,auVar108);
      auVar157 = vunpckhps_avx(auVar97,auVar108);
      auVar97 = *(undefined1 (*) [16])(lVar8 + uVar81 * 4);
      auVar108 = *(undefined1 (*) [16])(lVar10 + uVar85 * 4);
      auVar176 = vunpcklps_avx(auVar97,auVar108);
      auVar97 = vunpckhps_avx(auVar97,auVar108);
      auVar35 = vunpcklps_avx(auVar157,auVar97);
      auVar36 = vunpcklps_avx(auVar124,auVar176);
      auVar157 = vunpckhps_avx(auVar124,auVar176);
      auVar97 = vshufps_avx(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),0);
      auVar108 = vshufps_avx(ZEXT416((uint)(1.0 - fVar106)),ZEXT416((uint)(1.0 - fVar106)),0);
      fVar106 = auVar97._0_4_;
      fVar116 = auVar97._4_4_;
      fVar118 = auVar97._8_4_;
      fVar23 = auVar97._12_4_;
      fVar105 = auVar108._0_4_;
      fVar115 = auVar108._4_4_;
      fVar117 = auVar108._8_4_;
      fVar131 = auVar108._12_4_;
      auVar111._4_4_ = fVar115 * (float)local_1310._4_4_ + auVar145._4_4_ * fVar116;
      auVar111._0_4_ = fVar105 * (float)local_1310._0_4_ + auVar145._0_4_ * fVar106;
      auVar111._8_4_ = fVar117 * fStack_1308 + auVar145._8_4_ * fVar118;
      auVar111._12_4_ = fVar131 * fStack_1304 + auVar145._12_4_ * fVar23;
      local_1500._0_4_ = auVar143._0_4_;
      local_1500._4_4_ = auVar143._4_4_;
      fStack_14f8 = auVar143._8_4_;
      fStack_14f4 = auVar143._12_4_;
      auVar147._4_4_ = fVar115 * (float)local_1500._4_4_ + fVar116 * auVar142._4_4_;
      auVar147._0_4_ = fVar105 * (float)local_1500._0_4_ + fVar106 * auVar142._0_4_;
      auVar147._8_4_ = fVar117 * fStack_14f8 + fVar118 * auVar142._8_4_;
      auVar147._12_4_ = fVar131 * fStack_14f4 + fVar23 * auVar142._12_4_;
      local_14a0._0_4_ = auVar167._0_4_;
      local_14a0._4_4_ = auVar167._4_4_;
      fStack_1498 = auVar167._8_4_;
      fStack_1494 = auVar167._12_4_;
      auVar172._4_4_ = fVar115 * (float)local_14a0._4_4_ + auVar159._4_4_ * fVar116;
      auVar172._0_4_ = fVar105 * (float)local_14a0._0_4_ + auVar159._0_4_ * fVar106;
      auVar172._8_4_ = fVar117 * fStack_1498 + auVar159._8_4_ * fVar118;
      auVar172._12_4_ = fVar131 * fStack_1494 + auVar159._12_4_ * fVar23;
      local_1520._0_4_ = auVar109._0_4_;
      local_1520._4_4_ = auVar109._4_4_;
      fStack_1518 = auVar109._8_4_;
      fStack_1514 = auVar109._12_4_;
      auVar176._0_4_ = fVar105 * (float)local_1520._0_4_ + fVar106 * auVar98._0_4_;
      auVar176._4_4_ = fVar115 * (float)local_1520._4_4_ + fVar116 * auVar98._4_4_;
      auVar176._8_4_ = fVar117 * fStack_1518 + fVar118 * auVar98._8_4_;
      auVar176._12_4_ = fVar131 * fStack_1514 + fVar23 * auVar98._12_4_;
      local_14e0._0_4_ = auVar144._0_4_;
      local_14e0._4_4_ = auVar144._4_4_;
      fStack_14d8 = auVar144._8_4_;
      fStack_14d4 = auVar144._12_4_;
      auVar124._0_4_ = fVar105 * (float)local_14e0._0_4_ + auVar107._0_4_ * fVar106;
      auVar124._4_4_ = fVar115 * (float)local_14e0._4_4_ + auVar107._4_4_ * fVar116;
      auVar124._8_4_ = fVar117 * fStack_14d8 + auVar107._8_4_ * fVar118;
      auVar124._12_4_ = fVar131 * fStack_14d4 + auVar107._12_4_ * fVar23;
      local_1480._0_4_ = auVar158._0_4_;
      local_1480._4_4_ = auVar158._4_4_;
      fStack_1478 = auVar158._8_4_;
      fStack_1474 = auVar158._12_4_;
      auVar244._0_4_ = fVar105 * (float)local_1480._0_4_ + auVar168._0_4_ * fVar106;
      auVar244._4_4_ = fVar115 * (float)local_1480._4_4_ + auVar168._4_4_ * fVar116;
      auVar244._8_4_ = fVar117 * fStack_1478 + auVar168._8_4_ * fVar118;
      auVar244._12_4_ = fVar131 * fStack_1474 + auVar168._12_4_ * fVar23;
      auVar111._20_4_ = fVar115 * (float)local_1340._4_4_ + fVar116 * auVar169._4_4_;
      auVar111._16_4_ = fVar105 * (float)local_1340._0_4_ + fVar106 * auVar169._0_4_;
      auVar111._24_4_ = fVar117 * fStack_1338 + fVar118 * auVar169._8_4_;
      auVar111._28_4_ = fVar131 * fStack_1334 + fVar23 * auVar169._12_4_;
      auVar147._20_4_ = fVar115 * (float)local_1330._4_4_ + auVar156._4_4_ * fVar116;
      auVar147._16_4_ = fVar105 * (float)local_1330._0_4_ + auVar156._0_4_ * fVar106;
      auVar147._24_4_ = fVar117 * fStack_1328 + auVar156._8_4_ * fVar118;
      auVar147._28_4_ = fVar131 * fStack_1324 + auVar156._12_4_ * fVar23;
      local_1640 = auVar123._0_4_;
      fStack_163c = auVar123._4_4_;
      fStack_1638 = auVar123._8_4_;
      fStack_1634 = auVar123._12_4_;
      auVar172._20_4_ = fVar115 * fStack_163c + auVar161._4_4_ * fVar116;
      auVar172._16_4_ = fVar105 * local_1640 + auVar161._0_4_ * fVar106;
      auVar172._24_4_ = fVar117 * fStack_1638 + auVar161._8_4_ * fVar118;
      auVar172._28_4_ = fVar131 * fStack_1634 + auVar161._12_4_ * fVar23;
      lVar8 = uVar67 + 0x40 + lVar68;
      local_10e0 = *(undefined8 *)(lVar8 + 0x10);
      uStack_10d8 = *(undefined8 *)(lVar8 + 0x18);
      auVar161._0_4_ = auVar166._0_4_ * fVar105 + fVar106 * auVar36._0_4_;
      auVar161._4_4_ = auVar166._4_4_ * fVar115 + fVar116 * auVar36._4_4_;
      auVar161._8_4_ = auVar166._8_4_ * fVar117 + fVar118 * auVar36._8_4_;
      auVar161._12_4_ = auVar166._12_4_ * fVar131 + fVar23 * auVar36._12_4_;
      uStack_10d0 = local_10e0;
      uStack_10c8 = uStack_10d8;
      lVar68 = uVar67 + 0x50 + lVar68;
      local_1300 = *(undefined8 *)(lVar68 + 0x10);
      uStack_12f8 = *(undefined8 *)(lVar68 + 0x18);
      auVar169._0_4_ = fVar105 * (float)local_1320._0_4_ + fVar106 * auVar157._0_4_;
      auVar169._4_4_ = fVar115 * (float)local_1320._4_4_ + fVar116 * auVar157._4_4_;
      auVar169._8_4_ = fVar117 * fStack_1318 + fVar118 * auVar157._8_4_;
      auVar169._12_4_ = fVar131 * fStack_1314 + fVar23 * auVar157._12_4_;
      local_1650 = auVar160._0_4_;
      fStack_164c = auVar160._4_4_;
      fStack_1648 = auVar160._8_4_;
      fStack_1644 = auVar160._12_4_;
      auVar98._0_4_ = fVar105 * local_1650 + fVar106 * auVar35._0_4_;
      auVar98._4_4_ = fVar115 * fStack_164c + fVar116 * auVar35._4_4_;
      auVar98._8_4_ = fVar117 * fStack_1648 + fVar118 * auVar35._8_4_;
      auVar98._12_4_ = fVar131 * fStack_1644 + fVar23 * auVar35._12_4_;
      uStack_12f0 = local_1300;
      uStack_12e8 = uStack_12f8;
      auVar177._16_16_ = auVar176;
      auVar177._0_16_ = auVar176;
      auVar125._16_16_ = auVar124;
      auVar125._0_16_ = auVar124;
      auVar181._16_16_ = auVar244;
      auVar181._0_16_ = auVar244;
      auVar197._16_16_ = auVar161;
      auVar197._0_16_ = auVar161;
      auVar170._16_16_ = auVar169;
      auVar170._0_16_ = auVar169;
      auVar207._16_16_ = auVar98;
      auVar207._0_16_ = auVar98;
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar210._4_4_ = uVar3;
      auVar210._0_4_ = uVar3;
      auVar210._8_4_ = uVar3;
      auVar210._12_4_ = uVar3;
      auVar210._16_4_ = uVar3;
      auVar210._20_4_ = uVar3;
      auVar210._24_4_ = uVar3;
      auVar210._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar220._4_4_ = uVar3;
      auVar220._0_4_ = uVar3;
      auVar220._8_4_ = uVar3;
      auVar220._12_4_ = uVar3;
      auVar220._16_4_ = uVar3;
      auVar220._20_4_ = uVar3;
      auVar220._24_4_ = uVar3;
      auVar220._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar245._4_4_ = uVar3;
      auVar245._0_4_ = uVar3;
      auVar245._8_4_ = uVar3;
      auVar245._12_4_ = uVar3;
      auVar245._16_4_ = uVar3;
      auVar245._20_4_ = uVar3;
      auVar245._24_4_ = uVar3;
      auVar245._28_4_ = uVar3;
      local_1580 = vsubps_avx(auVar111,auVar210);
      local_1400 = vsubps_avx(auVar147,auVar220);
      local_1420 = vsubps_avx(auVar172,auVar245);
      auVar110 = vsubps_avx(auVar177,auVar210);
      auVar146 = vsubps_avx(auVar125,auVar220);
      auVar28 = vsubps_avx(auVar181,auVar245);
      auVar29 = vsubps_avx(auVar197,auVar210);
      auVar30 = vsubps_avx(auVar170,auVar220);
      auVar31 = vsubps_avx(auVar207,auVar245);
      local_1440 = vsubps_avx(auVar29,local_1580);
      local_1460 = vsubps_avx(auVar30,local_1400);
      _local_1480 = vsubps_avx(auVar31,local_1420);
      fVar23 = local_1400._0_4_;
      fVar106 = auVar30._0_4_ + fVar23;
      fVar117 = local_1400._4_4_;
      fVar116 = auVar30._4_4_ + fVar117;
      fVar134 = local_1400._8_4_;
      fVar118 = auVar30._8_4_ + fVar134;
      fVar140 = local_1400._12_4_;
      fVar119 = auVar30._12_4_ + fVar140;
      fVar14 = local_1400._16_4_;
      fVar120 = auVar30._16_4_ + fVar14;
      fVar17 = local_1400._20_4_;
      fVar121 = auVar30._20_4_ + fVar17;
      fVar20 = local_1400._24_4_;
      fVar122 = auVar30._24_4_ + fVar20;
      fVar105 = local_1420._0_4_;
      fVar179 = auVar31._0_4_ + fVar105;
      fVar131 = local_1420._4_4_;
      fVar183 = auVar31._4_4_ + fVar131;
      fVar136 = local_1420._8_4_;
      fVar185 = auVar31._8_4_ + fVar136;
      fVar12 = local_1420._12_4_;
      fVar187 = auVar31._12_4_ + fVar12;
      fVar15 = local_1420._16_4_;
      fVar189 = auVar31._16_4_ + fVar15;
      fVar18 = local_1420._20_4_;
      fVar191 = auVar31._20_4_ + fVar18;
      fVar21 = local_1420._24_4_;
      fVar193 = auVar31._24_4_ + fVar21;
      fVar196 = local_1420._28_4_;
      fVar24 = local_1480._0_4_;
      fVar25 = local_1480._4_4_;
      auVar32._4_4_ = fVar116 * fVar25;
      auVar32._0_4_ = fVar106 * fVar24;
      fVar26 = local_1480._8_4_;
      auVar32._8_4_ = fVar118 * fVar26;
      fVar27 = local_1480._12_4_;
      auVar32._12_4_ = fVar119 * fVar27;
      fVar96 = local_1480._16_4_;
      auVar32._16_4_ = fVar120 * fVar96;
      fVar103 = local_1480._20_4_;
      auVar32._20_4_ = fVar121 * fVar103;
      fVar104 = local_1480._24_4_;
      auVar32._24_4_ = fVar122 * fVar104;
      auVar32._28_4_ = auVar161._12_4_;
      fVar218 = local_1460._0_4_;
      fVar222 = local_1460._4_4_;
      auVar33._4_4_ = fVar222 * fVar183;
      auVar33._0_4_ = fVar218 * fVar179;
      fVar224 = local_1460._8_4_;
      auVar33._8_4_ = fVar224 * fVar185;
      fVar226 = local_1460._12_4_;
      auVar33._12_4_ = fVar226 * fVar187;
      fVar228 = local_1460._16_4_;
      auVar33._16_4_ = fVar228 * fVar189;
      fVar230 = local_1460._20_4_;
      auVar33._20_4_ = fVar230 * fVar191;
      fVar232 = local_1460._24_4_;
      auVar33._24_4_ = fVar232 * fVar193;
      auVar33._28_4_ = auVar98._12_4_;
      auVar32 = vsubps_avx(auVar33,auVar32);
      fVar115 = local_1580._0_4_;
      fVar195 = auVar29._0_4_ + fVar115;
      fVar132 = local_1580._4_4_;
      fVar201 = auVar29._4_4_ + fVar132;
      fVar138 = local_1580._8_4_;
      fVar202 = auVar29._8_4_ + fVar138;
      fVar13 = local_1580._12_4_;
      fVar203 = auVar29._12_4_ + fVar13;
      fVar16 = local_1580._16_4_;
      fVar204 = auVar29._16_4_ + fVar16;
      fVar19 = local_1580._20_4_;
      fVar205 = auVar29._20_4_ + fVar19;
      fVar22 = local_1580._24_4_;
      fVar206 = auVar29._24_4_ + fVar22;
      fVar209 = local_1440._0_4_;
      fVar212 = local_1440._4_4_;
      auVar34._4_4_ = fVar212 * fVar183;
      auVar34._0_4_ = fVar209 * fVar179;
      fVar213 = local_1440._8_4_;
      auVar34._8_4_ = fVar213 * fVar185;
      fVar214 = local_1440._12_4_;
      auVar34._12_4_ = fVar214 * fVar187;
      fVar215 = local_1440._16_4_;
      auVar34._16_4_ = fVar215 * fVar189;
      fVar216 = local_1440._20_4_;
      auVar34._20_4_ = fVar216 * fVar191;
      fVar217 = local_1440._24_4_;
      auVar34._24_4_ = fVar217 * fVar193;
      auVar34._28_4_ = auVar31._28_4_ + fVar196;
      auVar37._4_4_ = fVar201 * fVar25;
      auVar37._0_4_ = fVar195 * fVar24;
      auVar37._8_4_ = fVar202 * fVar26;
      auVar37._12_4_ = fVar203 * fVar27;
      auVar37._16_4_ = fVar204 * fVar96;
      auVar37._20_4_ = fVar205 * fVar103;
      auVar37._24_4_ = fVar206 * fVar104;
      auVar37._28_4_ = auVar98._12_4_;
      auVar33 = vsubps_avx(auVar37,auVar34);
      auVar38._4_4_ = fVar201 * fVar222;
      auVar38._0_4_ = fVar195 * fVar218;
      auVar38._8_4_ = fVar202 * fVar224;
      auVar38._12_4_ = fVar203 * fVar226;
      auVar38._16_4_ = fVar204 * fVar228;
      auVar38._20_4_ = fVar205 * fVar230;
      auVar38._24_4_ = fVar206 * fVar232;
      auVar38._28_4_ = auVar29._28_4_ + local_1580._28_4_;
      auVar39._4_4_ = fVar212 * fVar116;
      auVar39._0_4_ = fVar209 * fVar106;
      auVar39._8_4_ = fVar213 * fVar118;
      auVar39._12_4_ = fVar214 * fVar119;
      auVar39._16_4_ = fVar215 * fVar120;
      auVar39._20_4_ = fVar216 * fVar121;
      auVar39._24_4_ = fVar217 * fVar122;
      auVar39._28_4_ = auVar30._28_4_ + local_1400._28_4_;
      auVar34 = vsubps_avx(auVar39,auVar38);
      fVar106 = *(float *)(ray + k * 4 + 0xa0);
      fVar116 = *(float *)(ray + k * 4 + 0xc0);
      fVar118 = *(float *)(ray + k * 4 + 0x80);
      local_14c0._0_4_ = auVar32._0_4_ * fVar118 + fVar106 * auVar33._0_4_ + auVar34._0_4_ * fVar116
      ;
      local_14c0._4_4_ = auVar32._4_4_ * fVar118 + fVar106 * auVar33._4_4_ + auVar34._4_4_ * fVar116
      ;
      local_14c0._8_4_ = auVar32._8_4_ * fVar118 + fVar106 * auVar33._8_4_ + auVar34._8_4_ * fVar116
      ;
      local_14c0._12_4_ =
           auVar32._12_4_ * fVar118 + fVar106 * auVar33._12_4_ + auVar34._12_4_ * fVar116;
      local_14c0._16_4_ =
           auVar32._16_4_ * fVar118 + fVar106 * auVar33._16_4_ + auVar34._16_4_ * fVar116;
      local_14c0._20_4_ =
           auVar32._20_4_ * fVar118 + fVar106 * auVar33._20_4_ + auVar34._20_4_ * fVar116;
      local_14c0._24_4_ =
           auVar32._24_4_ * fVar118 + fVar106 * auVar33._24_4_ + auVar34._24_4_ * fVar116;
      local_14c0._28_4_ = auVar33._28_4_ + auVar33._28_4_ + auVar34._28_4_;
      _local_14a0 = vsubps_avx(local_1400,auVar146);
      auVar33 = vsubps_avx(local_1420,auVar28);
      fVar121 = fVar23 + auVar146._0_4_;
      fVar122 = fVar117 + auVar146._4_4_;
      fVar179 = fVar134 + auVar146._8_4_;
      fVar183 = fVar140 + auVar146._12_4_;
      fVar185 = fVar14 + auVar146._16_4_;
      fVar187 = fVar17 + auVar146._20_4_;
      fVar189 = fVar20 + auVar146._24_4_;
      fVar119 = auVar146._28_4_;
      fVar191 = fVar105 + auVar28._0_4_;
      fVar193 = fVar131 + auVar28._4_4_;
      fVar195 = fVar136 + auVar28._8_4_;
      fVar201 = fVar12 + auVar28._12_4_;
      fVar202 = fVar15 + auVar28._16_4_;
      fVar203 = fVar18 + auVar28._20_4_;
      fVar204 = fVar21 + auVar28._24_4_;
      fVar120 = auVar28._28_4_;
      fVar235 = auVar33._0_4_;
      fVar238 = auVar33._4_4_;
      auVar40._4_4_ = fVar238 * fVar122;
      auVar40._0_4_ = fVar235 * fVar121;
      fVar239 = auVar33._8_4_;
      auVar40._8_4_ = fVar239 * fVar179;
      fVar240 = auVar33._12_4_;
      auVar40._12_4_ = fVar240 * fVar183;
      fVar241 = auVar33._16_4_;
      auVar40._16_4_ = fVar241 * fVar185;
      fVar242 = auVar33._20_4_;
      auVar40._20_4_ = fVar242 * fVar187;
      fVar243 = auVar33._24_4_;
      auVar40._24_4_ = fVar243 * fVar189;
      auVar40._28_4_ = auVar32._28_4_;
      fVar180 = local_14a0._0_4_;
      fVar184 = local_14a0._4_4_;
      auVar41._4_4_ = fVar184 * fVar193;
      auVar41._0_4_ = fVar180 * fVar191;
      fVar186 = local_14a0._8_4_;
      auVar41._8_4_ = fVar186 * fVar195;
      fVar188 = local_14a0._12_4_;
      auVar41._12_4_ = fVar188 * fVar201;
      fVar190 = local_14a0._16_4_;
      auVar41._16_4_ = fVar190 * fVar202;
      fVar192 = local_14a0._20_4_;
      auVar41._20_4_ = fVar192 * fVar203;
      fVar194 = local_14a0._24_4_;
      auVar41._24_4_ = fVar194 * fVar204;
      auVar41._28_4_ = fVar196;
      auVar32 = vsubps_avx(auVar41,auVar40);
      auVar33 = vsubps_avx(local_1580,auVar110);
      fVar247 = auVar33._0_4_;
      fVar249 = auVar33._4_4_;
      auVar42._4_4_ = fVar249 * fVar193;
      auVar42._0_4_ = fVar247 * fVar191;
      fVar250 = auVar33._8_4_;
      auVar42._8_4_ = fVar250 * fVar195;
      fVar251 = auVar33._12_4_;
      auVar42._12_4_ = fVar251 * fVar201;
      fVar252 = auVar33._16_4_;
      auVar42._16_4_ = fVar252 * fVar202;
      fVar253 = auVar33._20_4_;
      auVar42._20_4_ = fVar253 * fVar203;
      fVar254 = auVar33._24_4_;
      auVar42._24_4_ = fVar254 * fVar204;
      auVar42._28_4_ = fVar196 + fVar120;
      fVar196 = auVar110._0_4_ + fVar115;
      fVar191 = auVar110._4_4_ + fVar132;
      fVar193 = auVar110._8_4_ + fVar138;
      fVar195 = auVar110._12_4_ + fVar13;
      fVar201 = auVar110._16_4_ + fVar16;
      fVar202 = auVar110._20_4_ + fVar19;
      fVar203 = auVar110._24_4_ + fVar22;
      fVar234 = auVar110._28_4_;
      auVar43._4_4_ = fVar191 * fVar238;
      auVar43._0_4_ = fVar196 * fVar235;
      auVar43._8_4_ = fVar193 * fVar239;
      auVar43._12_4_ = fVar195 * fVar240;
      auVar43._16_4_ = fVar201 * fVar241;
      auVar43._20_4_ = fVar202 * fVar242;
      auVar43._24_4_ = fVar203 * fVar243;
      auVar43._28_4_ = fVar234;
      auVar33 = vsubps_avx(auVar43,auVar42);
      auVar44._4_4_ = fVar191 * fVar184;
      auVar44._0_4_ = fVar196 * fVar180;
      auVar44._8_4_ = fVar193 * fVar186;
      auVar44._12_4_ = fVar195 * fVar188;
      auVar44._16_4_ = fVar201 * fVar190;
      auVar44._20_4_ = fVar202 * fVar192;
      auVar44._24_4_ = fVar203 * fVar194;
      auVar44._28_4_ = fVar234 + local_1580._28_4_;
      auVar45._4_4_ = fVar249 * fVar122;
      auVar45._0_4_ = fVar247 * fVar121;
      auVar45._8_4_ = fVar250 * fVar179;
      auVar45._12_4_ = fVar251 * fVar183;
      auVar45._16_4_ = fVar252 * fVar185;
      auVar45._20_4_ = fVar253 * fVar187;
      auVar45._24_4_ = fVar254 * fVar189;
      auVar45._28_4_ = local_1400._28_4_ + fVar119;
      auVar34 = vsubps_avx(auVar45,auVar44);
      local_14e0._0_4_ = fVar118 * auVar32._0_4_ + auVar34._0_4_ * fVar116 + fVar106 * auVar33._0_4_
      ;
      local_14e0._4_4_ = fVar118 * auVar32._4_4_ + auVar34._4_4_ * fVar116 + fVar106 * auVar33._4_4_
      ;
      fStack_14d8 = fVar118 * auVar32._8_4_ + auVar34._8_4_ * fVar116 + fVar106 * auVar33._8_4_;
      fStack_14d4 = fVar118 * auVar32._12_4_ + auVar34._12_4_ * fVar116 + fVar106 * auVar33._12_4_;
      register0x00001450 =
           fVar118 * auVar32._16_4_ + auVar34._16_4_ * fVar116 + fVar106 * auVar33._16_4_;
      register0x00001454 =
           fVar118 * auVar32._20_4_ + auVar34._20_4_ * fVar116 + fVar106 * auVar33._20_4_;
      register0x00001458 =
           fVar118 * auVar32._24_4_ + auVar34._24_4_ * fVar116 + fVar106 * auVar33._24_4_;
      register0x0000145c = auVar33._28_4_ + auVar34._28_4_ + auVar33._28_4_;
      auVar32 = vsubps_avx(auVar110,auVar29);
      fVar204 = auVar110._0_4_ + auVar29._0_4_;
      fVar205 = auVar110._4_4_ + auVar29._4_4_;
      fVar206 = auVar110._8_4_ + auVar29._8_4_;
      fVar133 = auVar110._12_4_ + auVar29._12_4_;
      fVar135 = auVar110._16_4_ + auVar29._16_4_;
      fVar137 = auVar110._20_4_ + auVar29._20_4_;
      fVar139 = auVar110._24_4_ + auVar29._24_4_;
      auVar33 = vsubps_avx(auVar146,auVar30);
      fVar141 = auVar146._0_4_ + auVar30._0_4_;
      fVar149 = auVar146._4_4_ + auVar30._4_4_;
      fVar150 = auVar146._8_4_ + auVar30._8_4_;
      fVar151 = auVar146._12_4_ + auVar30._12_4_;
      fVar152 = auVar146._16_4_ + auVar30._16_4_;
      fVar153 = auVar146._20_4_ + auVar30._20_4_;
      fVar154 = auVar146._24_4_ + auVar30._24_4_;
      fVar155 = fVar119 + auVar30._28_4_;
      auVar110 = vsubps_avx(auVar28,auVar31);
      fVar193 = auVar31._0_4_ + auVar28._0_4_;
      fVar195 = auVar31._4_4_ + auVar28._4_4_;
      fVar201 = auVar31._8_4_ + auVar28._8_4_;
      fVar202 = auVar31._12_4_ + auVar28._12_4_;
      fVar203 = auVar31._16_4_ + auVar28._16_4_;
      fVar164 = auVar31._20_4_ + auVar28._20_4_;
      fVar165 = auVar31._24_4_ + auVar28._24_4_;
      fVar219 = auVar110._0_4_;
      fVar223 = auVar110._4_4_;
      auVar28._4_4_ = fVar223 * fVar149;
      auVar28._0_4_ = fVar219 * fVar141;
      fVar225 = auVar110._8_4_;
      auVar28._8_4_ = fVar225 * fVar150;
      fVar227 = auVar110._12_4_;
      auVar28._12_4_ = fVar227 * fVar151;
      fVar229 = auVar110._16_4_;
      auVar28._16_4_ = fVar229 * fVar152;
      fVar231 = auVar110._20_4_;
      auVar28._20_4_ = fVar231 * fVar153;
      fVar233 = auVar110._24_4_;
      auVar28._24_4_ = fVar233 * fVar154;
      auVar28._28_4_ = fVar120;
      fVar196 = auVar33._0_4_;
      fVar121 = auVar33._4_4_;
      auVar30._4_4_ = fVar121 * fVar195;
      auVar30._0_4_ = fVar196 * fVar193;
      fVar122 = auVar33._8_4_;
      auVar30._8_4_ = fVar122 * fVar201;
      fVar179 = auVar33._12_4_;
      auVar30._12_4_ = fVar179 * fVar202;
      fVar183 = auVar33._16_4_;
      auVar30._16_4_ = fVar183 * fVar203;
      fVar185 = auVar33._20_4_;
      auVar30._20_4_ = fVar185 * fVar164;
      fVar187 = auVar33._24_4_;
      auVar30._24_4_ = fVar187 * fVar165;
      auVar30._28_4_ = fVar119;
      auVar110 = vsubps_avx(auVar30,auVar28);
      fVar189 = auVar32._0_4_;
      fVar191 = auVar32._4_4_;
      auVar46._4_4_ = fVar191 * fVar195;
      auVar46._0_4_ = fVar189 * fVar193;
      fVar193 = auVar32._8_4_;
      auVar46._8_4_ = fVar193 * fVar201;
      fVar195 = auVar32._12_4_;
      auVar46._12_4_ = fVar195 * fVar202;
      fVar201 = auVar32._16_4_;
      auVar46._16_4_ = fVar201 * fVar203;
      fVar202 = auVar32._20_4_;
      auVar46._20_4_ = fVar202 * fVar164;
      fVar203 = auVar32._24_4_;
      auVar46._24_4_ = fVar203 * fVar165;
      auVar46._28_4_ = auVar31._28_4_ + fVar120;
      auVar31._4_4_ = fVar223 * fVar205;
      auVar31._0_4_ = fVar219 * fVar204;
      auVar31._8_4_ = fVar225 * fVar206;
      auVar31._12_4_ = fVar227 * fVar133;
      auVar31._16_4_ = fVar229 * fVar135;
      auVar31._20_4_ = fVar231 * fVar137;
      auVar31._24_4_ = fVar233 * fVar139;
      auVar31._28_4_ = fVar119;
      auVar146 = vsubps_avx(auVar31,auVar46);
      auVar47._4_4_ = fVar205 * fVar121;
      auVar47._0_4_ = fVar204 * fVar196;
      auVar47._8_4_ = fVar206 * fVar122;
      auVar47._12_4_ = fVar133 * fVar179;
      auVar47._16_4_ = fVar135 * fVar183;
      auVar47._20_4_ = fVar137 * fVar185;
      auVar47._24_4_ = fVar139 * fVar187;
      auVar47._28_4_ = fVar234 + auVar29._28_4_;
      auVar29._4_4_ = fVar191 * fVar149;
      auVar29._0_4_ = fVar189 * fVar141;
      auVar29._8_4_ = fVar193 * fVar150;
      auVar29._12_4_ = fVar195 * fVar151;
      auVar29._16_4_ = fVar201 * fVar152;
      auVar29._20_4_ = fVar202 * fVar153;
      auVar29._24_4_ = fVar203 * fVar154;
      auVar29._28_4_ = fVar155;
      auVar28 = vsubps_avx(auVar29,auVar47);
      auVar126._0_4_ = fVar118 * auVar110._0_4_ + auVar28._0_4_ * fVar116 + fVar106 * auVar146._0_4_
      ;
      auVar126._4_4_ = fVar118 * auVar110._4_4_ + auVar28._4_4_ * fVar116 + fVar106 * auVar146._4_4_
      ;
      auVar126._8_4_ = fVar118 * auVar110._8_4_ + auVar28._8_4_ * fVar116 + fVar106 * auVar146._8_4_
      ;
      auVar126._12_4_ =
           fVar118 * auVar110._12_4_ + auVar28._12_4_ * fVar116 + fVar106 * auVar146._12_4_;
      auVar126._16_4_ =
           fVar118 * auVar110._16_4_ + auVar28._16_4_ * fVar116 + fVar106 * auVar146._16_4_;
      auVar126._20_4_ =
           fVar118 * auVar110._20_4_ + auVar28._20_4_ * fVar116 + fVar106 * auVar146._20_4_;
      auVar126._24_4_ =
           fVar118 * auVar110._24_4_ + auVar28._24_4_ * fVar116 + fVar106 * auVar146._24_4_;
      auVar126._28_4_ = fVar155 + auVar28._28_4_ + fVar155;
      local_1500._0_4_ = auVar126._0_4_ + local_14c0._0_4_ + (float)local_14e0._0_4_;
      local_1500._4_4_ = auVar126._4_4_ + local_14c0._4_4_ + (float)local_14e0._4_4_;
      fStack_14f8 = auVar126._8_4_ + local_14c0._8_4_ + fStack_14d8;
      fStack_14f4 = auVar126._12_4_ + local_14c0._12_4_ + fStack_14d4;
      register0x00001350 = auVar126._16_4_ + local_14c0._16_4_ + register0x00001450;
      register0x00001354 = auVar126._20_4_ + local_14c0._20_4_ + register0x00001454;
      register0x00001358 = auVar126._24_4_ + local_14c0._24_4_ + register0x00001458;
      register0x0000135c = auVar126._28_4_ + local_14c0._28_4_ + register0x0000145c;
      auVar110 = vminps_avx(local_14c0,_local_14e0);
      auVar110 = vminps_avx(auVar110,auVar126);
      auVar162._8_4_ = 0x7fffffff;
      auVar162._0_8_ = 0x7fffffff7fffffff;
      auVar162._12_4_ = 0x7fffffff;
      auVar162._16_4_ = 0x7fffffff;
      auVar162._20_4_ = 0x7fffffff;
      auVar162._24_4_ = 0x7fffffff;
      auVar162._28_4_ = 0x7fffffff;
      _local_1520 = vandps_avx(_local_1500,auVar162);
      fVar120 = local_1520._0_4_ * 1.1920929e-07;
      fVar204 = local_1520._4_4_ * 1.1920929e-07;
      auVar48._4_4_ = fVar204;
      auVar48._0_4_ = fVar120;
      fVar205 = local_1520._8_4_ * 1.1920929e-07;
      auVar48._8_4_ = fVar205;
      fVar206 = local_1520._12_4_ * 1.1920929e-07;
      auVar48._12_4_ = fVar206;
      fVar133 = local_1520._16_4_ * 1.1920929e-07;
      auVar48._16_4_ = fVar133;
      fVar135 = local_1520._20_4_ * 1.1920929e-07;
      auVar48._20_4_ = fVar135;
      fVar137 = local_1520._24_4_ * 1.1920929e-07;
      auVar48._24_4_ = fVar137;
      auVar48._28_4_ = 0x34000000;
      auVar171._0_8_ = CONCAT44(fVar204,fVar120) ^ 0x8000000080000000;
      auVar171._8_4_ = -fVar205;
      auVar171._12_4_ = -fVar206;
      auVar171._16_4_ = -fVar133;
      auVar171._20_4_ = -fVar135;
      auVar171._24_4_ = -fVar137;
      auVar171._28_4_ = 0xb4000000;
      auVar110 = vcmpps_avx(auVar110,auVar171,5);
      auVar28 = vmaxps_avx(local_14c0,_local_14e0);
      auVar146 = vmaxps_avx(auVar28,auVar126);
      auVar146 = vcmpps_avx(auVar146,auVar48,2);
      auVar146 = vorps_avx(auVar110,auVar146);
      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar146 >> 0x7f,0) != '\0') ||
            (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar146 >> 0xbf,0) != '\0') ||
          (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar146[0x1f] < '\0') {
        auVar49._4_4_ = fVar184 * fVar25;
        auVar49._0_4_ = fVar180 * fVar24;
        auVar49._8_4_ = fVar186 * fVar26;
        auVar49._12_4_ = fVar188 * fVar27;
        auVar49._16_4_ = fVar190 * fVar96;
        auVar49._20_4_ = fVar192 * fVar103;
        auVar49._24_4_ = fVar194 * fVar104;
        auVar49._28_4_ = auVar110._28_4_;
        auVar50._4_4_ = fVar222 * fVar238;
        auVar50._0_4_ = fVar218 * fVar235;
        auVar50._8_4_ = fVar224 * fVar239;
        auVar50._12_4_ = fVar226 * fVar240;
        auVar50._16_4_ = fVar228 * fVar241;
        auVar50._20_4_ = fVar230 * fVar242;
        auVar50._24_4_ = fVar232 * fVar243;
        auVar50._28_4_ = 0x34000000;
        auVar29 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = fVar238 * fVar121;
        auVar51._0_4_ = fVar235 * fVar196;
        auVar51._8_4_ = fVar239 * fVar122;
        auVar51._12_4_ = fVar240 * fVar179;
        auVar51._16_4_ = fVar241 * fVar183;
        auVar51._20_4_ = fVar242 * fVar185;
        auVar51._24_4_ = fVar243 * fVar187;
        auVar51._28_4_ = auVar28._28_4_;
        auVar52._4_4_ = fVar184 * fVar223;
        auVar52._0_4_ = fVar180 * fVar219;
        auVar52._8_4_ = fVar186 * fVar225;
        auVar52._12_4_ = fVar188 * fVar227;
        auVar52._16_4_ = fVar190 * fVar229;
        auVar52._20_4_ = fVar192 * fVar231;
        auVar52._24_4_ = fVar194 * fVar233;
        auVar52._28_4_ = fVar119;
        auVar30 = vsubps_avx(auVar52,auVar51);
        auVar198._8_4_ = 0x7fffffff;
        auVar198._0_8_ = 0x7fffffff7fffffff;
        auVar198._12_4_ = 0x7fffffff;
        auVar198._16_4_ = 0x7fffffff;
        auVar198._20_4_ = 0x7fffffff;
        auVar198._24_4_ = 0x7fffffff;
        auVar198._28_4_ = 0x7fffffff;
        auVar110 = vandps_avx(auVar198,auVar49);
        auVar28 = vandps_avx(auVar198,auVar51);
        auVar110 = vcmpps_avx(auVar110,auVar28,1);
        local_1280 = vblendvps_avx(auVar30,auVar29,auVar110);
        auVar53._4_4_ = fVar249 * fVar223;
        auVar53._0_4_ = fVar247 * fVar219;
        auVar53._8_4_ = fVar250 * fVar225;
        auVar53._12_4_ = fVar251 * fVar227;
        auVar53._16_4_ = fVar252 * fVar229;
        auVar53._20_4_ = fVar253 * fVar231;
        auVar53._24_4_ = fVar254 * fVar233;
        auVar53._28_4_ = auVar110._28_4_;
        auVar54._4_4_ = fVar249 * fVar25;
        auVar54._0_4_ = fVar247 * fVar24;
        auVar54._8_4_ = fVar250 * fVar26;
        auVar54._12_4_ = fVar251 * fVar27;
        auVar54._16_4_ = fVar252 * fVar96;
        auVar54._20_4_ = fVar253 * fVar103;
        auVar54._24_4_ = fVar254 * fVar104;
        auVar54._28_4_ = auVar29._28_4_;
        auVar55._4_4_ = fVar238 * fVar212;
        auVar55._0_4_ = fVar235 * fVar209;
        auVar55._8_4_ = fVar239 * fVar213;
        auVar55._12_4_ = fVar240 * fVar214;
        auVar55._16_4_ = fVar241 * fVar215;
        auVar55._20_4_ = fVar242 * fVar216;
        auVar55._24_4_ = fVar243 * fVar217;
        auVar55._28_4_ = auVar28._28_4_;
        auVar29 = vsubps_avx(auVar54,auVar55);
        auVar56._4_4_ = fVar238 * fVar191;
        auVar56._0_4_ = fVar235 * fVar189;
        auVar56._8_4_ = fVar239 * fVar193;
        auVar56._12_4_ = fVar240 * fVar195;
        auVar56._16_4_ = fVar241 * fVar201;
        auVar56._20_4_ = fVar242 * fVar202;
        auVar56._24_4_ = fVar243 * fVar203;
        auVar56._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar56,auVar53);
        auVar110 = vandps_avx(auVar198,auVar55);
        auVar28 = vandps_avx(auVar198,auVar53);
        auVar110 = vcmpps_avx(auVar110,auVar28,1);
        local_1260 = vblendvps_avx(auVar30,auVar29,auVar110);
        auVar57._4_4_ = fVar184 * fVar191;
        auVar57._0_4_ = fVar180 * fVar189;
        auVar57._8_4_ = fVar186 * fVar193;
        auVar57._12_4_ = fVar188 * fVar195;
        auVar57._16_4_ = fVar190 * fVar201;
        auVar57._20_4_ = fVar192 * fVar202;
        auVar57._24_4_ = fVar194 * fVar203;
        auVar57._28_4_ = auVar32._28_4_;
        auVar58._4_4_ = fVar184 * fVar212;
        auVar58._0_4_ = fVar180 * fVar209;
        auVar58._8_4_ = fVar186 * fVar213;
        auVar58._12_4_ = fVar188 * fVar214;
        auVar58._16_4_ = fVar190 * fVar215;
        auVar58._20_4_ = fVar192 * fVar216;
        auVar58._24_4_ = fVar194 * fVar217;
        auVar58._28_4_ = auVar110._28_4_;
        auVar59._4_4_ = fVar249 * fVar222;
        auVar59._0_4_ = fVar247 * fVar218;
        auVar59._8_4_ = fVar250 * fVar224;
        auVar59._12_4_ = fVar251 * fVar226;
        auVar59._16_4_ = fVar252 * fVar228;
        auVar59._20_4_ = fVar253 * fVar230;
        auVar59._24_4_ = fVar254 * fVar232;
        auVar59._28_4_ = auVar29._28_4_;
        auVar60._4_4_ = fVar249 * fVar121;
        auVar60._0_4_ = fVar247 * fVar196;
        auVar60._8_4_ = fVar250 * fVar122;
        auVar60._12_4_ = fVar251 * fVar179;
        auVar60._16_4_ = fVar252 * fVar183;
        auVar60._20_4_ = fVar253 * fVar185;
        auVar60._24_4_ = fVar254 * fVar187;
        auVar60._28_4_ = auVar33._28_4_;
        auVar29 = vsubps_avx(auVar58,auVar59);
        auVar30 = vsubps_avx(auVar60,auVar57);
        auVar110 = vandps_avx(auVar198,auVar59);
        auVar28 = vandps_avx(auVar198,auVar57);
        auVar28 = vcmpps_avx(auVar110,auVar28,1);
        local_1240 = vblendvps_avx(auVar30,auVar29,auVar28);
        auVar97 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
        fVar183 = local_1240._0_4_;
        fVar185 = local_1240._4_4_;
        fVar187 = local_1240._8_4_;
        fVar189 = local_1240._12_4_;
        fVar191 = local_1240._16_4_;
        fVar193 = local_1240._20_4_;
        fVar195 = local_1240._24_4_;
        fVar201 = local_1260._0_4_;
        fVar202 = local_1260._4_4_;
        fVar203 = local_1260._8_4_;
        fVar204 = local_1260._12_4_;
        fVar205 = local_1260._16_4_;
        fVar206 = local_1260._20_4_;
        fVar133 = local_1260._24_4_;
        fVar196 = local_1280._0_4_;
        fVar119 = local_1280._4_4_;
        fVar120 = local_1280._8_4_;
        fVar24 = local_1280._12_4_;
        fVar25 = local_1280._16_4_;
        fVar26 = local_1280._20_4_;
        fVar27 = local_1280._24_4_;
        fVar96 = fVar118 * fVar196 + fVar183 * fVar116 + fVar201 * fVar106;
        fVar103 = fVar118 * fVar119 + fVar185 * fVar116 + fVar202 * fVar106;
        fVar104 = fVar118 * fVar120 + fVar187 * fVar116 + fVar203 * fVar106;
        fVar121 = fVar118 * fVar24 + fVar189 * fVar116 + fVar204 * fVar106;
        fVar122 = fVar118 * fVar25 + fVar191 * fVar116 + fVar205 * fVar106;
        fVar179 = fVar118 * fVar26 + fVar193 * fVar116 + fVar206 * fVar106;
        fVar106 = fVar118 * fVar27 + fVar195 * fVar116 + fVar133 * fVar106;
        fVar116 = auVar146._28_4_ + auVar146._28_4_ + 0.0;
        auVar99._0_4_ = fVar96 + fVar96;
        auVar99._4_4_ = fVar103 + fVar103;
        auVar99._8_4_ = fVar104 + fVar104;
        auVar99._12_4_ = fVar121 + fVar121;
        auVar99._16_4_ = fVar122 + fVar122;
        auVar99._20_4_ = fVar179 + fVar179;
        auVar99._24_4_ = fVar106 + fVar106;
        auVar99._28_4_ = fVar116 + fVar116;
        fVar96 = fVar196 * fVar115 + fVar183 * fVar105 + fVar201 * fVar23;
        fVar131 = fVar119 * fVar132 + fVar185 * fVar131 + fVar202 * fVar117;
        fVar132 = fVar120 * fVar138 + fVar187 * fVar136 + fVar203 * fVar134;
        fVar134 = fVar24 * fVar13 + fVar189 * fVar12 + fVar204 * fVar140;
        fVar136 = fVar25 * fVar16 + fVar191 * fVar15 + fVar205 * fVar14;
        fVar138 = fVar26 * fVar19 + fVar193 * fVar18 + fVar206 * fVar17;
        fVar140 = fVar27 * fVar22 + fVar195 * fVar21 + fVar133 * fVar20;
        auVar146 = vrcpps_avx(auVar99);
        fVar106 = auVar146._0_4_;
        fVar116 = auVar146._4_4_;
        auVar61._4_4_ = auVar99._4_4_ * fVar116;
        auVar61._0_4_ = auVar99._0_4_ * fVar106;
        fVar118 = auVar146._8_4_;
        auVar61._8_4_ = auVar99._8_4_ * fVar118;
        fVar23 = auVar146._12_4_;
        auVar61._12_4_ = auVar99._12_4_ * fVar23;
        fVar105 = auVar146._16_4_;
        auVar61._16_4_ = auVar99._16_4_ * fVar105;
        fVar115 = auVar146._20_4_;
        auVar61._20_4_ = auVar99._20_4_ * fVar115;
        fVar117 = auVar146._24_4_;
        auVar61._24_4_ = auVar99._24_4_ * fVar117;
        auVar61._28_4_ = auVar110._28_4_;
        auVar173._8_4_ = 0x3f800000;
        auVar173._0_8_ = 0x3f8000003f800000;
        auVar173._12_4_ = 0x3f800000;
        auVar173._16_4_ = 0x3f800000;
        auVar173._20_4_ = 0x3f800000;
        auVar173._24_4_ = 0x3f800000;
        auVar173._28_4_ = 0x3f800000;
        auVar110 = vsubps_avx(auVar173,auVar61);
        local_11c0._4_4_ = (fVar131 + fVar131) * (fVar116 + fVar116 * auVar110._4_4_);
        local_11c0._0_4_ = (fVar96 + fVar96) * (fVar106 + fVar106 * auVar110._0_4_);
        local_11c0._8_4_ = (fVar132 + fVar132) * (fVar118 + fVar118 * auVar110._8_4_);
        local_11c0._12_4_ = (fVar134 + fVar134) * (fVar23 + fVar23 * auVar110._12_4_);
        local_11c0._16_4_ = (fVar136 + fVar136) * (fVar105 + fVar105 * auVar110._16_4_);
        local_11c0._20_4_ = (fVar138 + fVar138) * (fVar115 + fVar115 * auVar110._20_4_);
        local_11c0._24_4_ = (fVar140 + fVar140) * (fVar117 + fVar117 * auVar110._24_4_);
        local_11c0._28_4_ = local_1460._28_4_;
        auVar102 = ZEXT3264(local_11c0);
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar127._4_4_ = uVar3;
        auVar127._0_4_ = uVar3;
        auVar127._8_4_ = uVar3;
        auVar127._12_4_ = uVar3;
        auVar127._16_4_ = uVar3;
        auVar127._20_4_ = uVar3;
        auVar127._24_4_ = uVar3;
        auVar127._28_4_ = uVar3;
        auVar110 = vcmpps_avx(auVar127,local_11c0,2);
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar236._4_4_ = uVar3;
        auVar236._0_4_ = uVar3;
        auVar236._8_4_ = uVar3;
        auVar236._12_4_ = uVar3;
        auVar236._16_4_ = uVar3;
        auVar236._20_4_ = uVar3;
        auVar236._24_4_ = uVar3;
        auVar236._28_4_ = uVar3;
        auVar175 = ZEXT3264(auVar236);
        auVar146 = vcmpps_avx(local_11c0,auVar236,2);
        auVar110 = vandps_avx(auVar146,auVar110);
        auVar108 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar97 = vpand_avx(auVar108,auVar97);
        auVar108 = vpmovsxwd_avx(auVar97);
        auVar142 = vpshufd_avx(auVar97,0xee);
        auVar142 = vpmovsxwd_avx(auVar142);
        auVar128._16_16_ = auVar142;
        auVar128._0_16_ = auVar108;
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0x7f,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar142 >> 0x3f,0) != '\0') ||
            (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar142[0xf] < '\0') {
          auVar110 = vcmpps_avx(auVar99,_DAT_01f7b000,4);
          auVar108 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
          auVar97 = vpand_avx(auVar97,auVar108);
          auVar108 = vpmovsxwd_avx(auVar97);
          auVar142 = vpunpckhwd_avx(auVar97,auVar97);
          local_1560._16_16_ = auVar142;
          local_1560._0_16_ = auVar108;
          if ((((((((local_1560 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_1560 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_1560 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_1560 >> 0x7f,0) != '\0') ||
                (local_1560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar142 >> 0x3f,0) != '\0') ||
              (local_1560 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0xf] < '\0') {
            local_12e0 = local_14c0;
            local_12c0 = _local_14e0;
            local_12a0 = _local_1500;
            auVar110 = vrcpps_avx(_local_1500);
            fVar106 = auVar110._0_4_;
            fVar116 = auVar110._4_4_;
            auVar62._4_4_ = (float)local_1500._4_4_ * fVar116;
            auVar62._0_4_ = (float)local_1500._0_4_ * fVar106;
            fVar118 = auVar110._8_4_;
            auVar62._8_4_ = fStack_14f8 * fVar118;
            fVar23 = auVar110._12_4_;
            auVar62._12_4_ = fStack_14f4 * fVar23;
            fVar105 = auVar110._16_4_;
            auVar62._16_4_ = register0x00001350 * fVar105;
            fVar115 = auVar110._20_4_;
            auVar62._20_4_ = register0x00001354 * fVar115;
            fVar117 = auVar110._24_4_;
            auVar62._24_4_ = register0x00001358 * fVar117;
            auVar62._28_4_ = register0x0000135c;
            auVar199._8_4_ = 0x3f800000;
            auVar199._0_8_ = 0x3f8000003f800000;
            auVar199._12_4_ = 0x3f800000;
            auVar199._16_4_ = 0x3f800000;
            auVar199._20_4_ = 0x3f800000;
            auVar199._24_4_ = 0x3f800000;
            auVar199._28_4_ = 0x3f800000;
            auVar146 = vsubps_avx(auVar199,auVar62);
            auVar163._0_4_ = fVar106 + fVar106 * auVar146._0_4_;
            auVar163._4_4_ = fVar116 + fVar116 * auVar146._4_4_;
            auVar163._8_4_ = fVar118 + fVar118 * auVar146._8_4_;
            auVar163._12_4_ = fVar23 + fVar23 * auVar146._12_4_;
            auVar163._16_4_ = fVar105 + fVar105 * auVar146._16_4_;
            auVar163._20_4_ = fVar115 + fVar115 * auVar146._20_4_;
            auVar163._24_4_ = fVar117 + fVar117 * auVar146._24_4_;
            auVar163._28_4_ = auVar110._28_4_ + auVar146._28_4_;
            auVar174._8_4_ = 0x219392ef;
            auVar174._0_8_ = 0x219392ef219392ef;
            auVar174._12_4_ = 0x219392ef;
            auVar174._16_4_ = 0x219392ef;
            auVar174._20_4_ = 0x219392ef;
            auVar174._24_4_ = 0x219392ef;
            auVar174._28_4_ = 0x219392ef;
            auVar146 = vcmpps_avx(_local_1520,auVar174,5);
            auVar110 = vandps_avx(auVar146,auVar163);
            local_1220 = local_1560;
            local_1140 = local_1100;
            auVar63._4_4_ = local_14c0._4_4_ * auVar110._4_4_;
            auVar63._0_4_ = local_14c0._0_4_ * auVar110._0_4_;
            auVar63._8_4_ = local_14c0._8_4_ * auVar110._8_4_;
            auVar63._12_4_ = local_14c0._12_4_ * auVar110._12_4_;
            auVar63._16_4_ = local_14c0._16_4_ * auVar110._16_4_;
            auVar63._20_4_ = local_14c0._20_4_ * auVar110._20_4_;
            auVar63._24_4_ = local_14c0._24_4_ * auVar110._24_4_;
            auVar63._28_4_ = auVar146._28_4_;
            auVar146 = vminps_avx(auVar63,auVar199);
            auVar64._4_4_ = (float)local_14e0._4_4_ * auVar110._4_4_;
            auVar64._0_4_ = (float)local_14e0._0_4_ * auVar110._0_4_;
            auVar64._8_4_ = fStack_14d8 * auVar110._8_4_;
            auVar64._12_4_ = fStack_14d4 * auVar110._12_4_;
            auVar64._16_4_ = register0x00001450 * auVar110._16_4_;
            auVar64._20_4_ = register0x00001454 * auVar110._20_4_;
            auVar64._24_4_ = register0x00001458 * auVar110._24_4_;
            auVar64._28_4_ = auVar110._28_4_;
            auVar110 = vminps_avx(auVar64,auVar199);
            auVar28 = vsubps_avx(auVar199,auVar146);
            local_11e0 = vblendvps_avx(auVar110,auVar28,local_1100);
            auVar110 = vsubps_avx(auVar199,auVar110);
            local_1200 = vblendvps_avx(auVar146,auVar110,local_1100);
            fVar106 = local_1120._0_4_;
            fVar116 = local_1120._4_4_;
            fVar118 = local_1120._8_4_;
            fVar23 = local_1120._12_4_;
            fVar105 = local_1120._16_4_;
            fVar115 = local_1120._20_4_;
            fVar117 = local_1120._24_4_;
            uStack_1184 = local_1200._28_4_;
            local_11a0[0] = fVar196 * fVar106;
            local_11a0[1] = fVar119 * fVar116;
            local_11a0[2] = fVar120 * fVar118;
            local_11a0[3] = fVar24 * fVar23;
            fStack_1190 = fVar25 * fVar105;
            fStack_118c = fVar26 * fVar115;
            fStack_1188 = fVar27 * fVar117;
            local_1180[0] = fVar201 * fVar106;
            local_1180[1] = fVar202 * fVar116;
            local_1180[2] = fVar203 * fVar118;
            local_1180[3] = fVar204 * fVar23;
            fStack_1170 = fVar205 * fVar105;
            fStack_116c = fVar206 * fVar115;
            fStack_1168 = fVar133 * fVar117;
            uStack_1164 = uStack_1184;
            auVar129._16_16_ = auVar142;
            auVar129._0_16_ = auVar108;
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar110 = vblendvps_avx(auVar148,local_11c0,auVar129);
            local_1160[0] = fVar106 * fVar183;
            local_1160[1] = fVar116 * fVar185;
            local_1160[2] = fVar118 * fVar187;
            local_1160[3] = fVar23 * fVar189;
            fStack_1150 = fVar105 * fVar191;
            fStack_114c = fVar115 * fVar193;
            fStack_1148 = fVar117 * fVar195;
            uStack_1144 = uStack_1184;
            auVar146 = vshufps_avx(auVar110,auVar110,0xb1);
            auVar146 = vminps_avx(auVar110,auVar146);
            auVar28 = vshufpd_avx(auVar146,auVar146,5);
            auVar146 = vminps_avx(auVar146,auVar28);
            auVar28 = vperm2f128_avx(auVar146,auVar146,1);
            auVar146 = vminps_avx(auVar146,auVar28);
            auVar110 = vcmpps_avx(auVar110,auVar146,0);
            auVar108 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
            auVar97 = vpand_avx(auVar108,auVar97);
            auVar108 = vpmovsxwd_avx(auVar97);
            auVar97 = vpunpckhwd_avx(auVar97,auVar97);
            auVar112._16_16_ = auVar97;
            auVar112._0_16_ = auVar108;
            if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar112 >> 0x7f,0) == '\0') &&
                  (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar97 >> 0x3f,0) == '\0') &&
                (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar97[0xf]) {
              auVar112 = local_1560;
            }
            uVar66 = vmovmskps_avx(auVar112);
            uVar70 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            auVar110 = vcmpps_avx(local_11e0,local_11e0,0xf);
            auVar178 = ZEXT3264(auVar110);
LAB_00f8c2a2:
            uVar74 = (ulong)uVar70;
            uVar70 = *(uint *)((long)&local_10e0 + uVar74 * 4);
            pGVar92 = (pSVar6->geometries).items[uVar70].ptr;
            if ((pGVar92->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_1560 + uVar74 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar92->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar3 = *(undefined4 *)(local_1200 + uVar74 * 4);
                uVar4 = *(undefined4 *)(local_11e0 + uVar74 * 4);
                *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar74 - 8];
                *(float *)(ray + k * 4 + 0x180) = local_11a0[uVar74];
                *(float *)(ray + k * 4 + 0x1a0) = local_1180[uVar74];
                *(float *)(ray + k * 4 + 0x1c0) = local_1160[uVar74];
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&local_1300 + uVar74 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar70;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                goto LAB_00f8c75c;
              }
              local_1060 = *(undefined4 *)(local_1200 + uVar74 * 4);
              local_1040 = *(undefined4 *)(local_11e0 + uVar74 * 4);
              auStack_ff0 = vpshufd_avx(ZEXT416(uVar70),0);
              local_1020 = *(undefined4 *)((long)&local_1300 + uVar74 * 4);
              fVar106 = local_11a0[uVar74];
              fVar116 = local_1180[uVar74];
              local_10a0._4_4_ = fVar116;
              local_10a0._0_4_ = fVar116;
              local_10a0._8_4_ = fVar116;
              local_10a0._12_4_ = fVar116;
              local_10a0._16_4_ = fVar116;
              local_10a0._20_4_ = fVar116;
              local_10a0._24_4_ = fVar116;
              local_10a0._28_4_ = fVar116;
              fVar116 = local_1160[uVar74];
              local_1080._4_4_ = fVar116;
              local_1080._0_4_ = fVar116;
              local_1080._8_4_ = fVar116;
              local_1080._12_4_ = fVar116;
              local_1080._16_4_ = fVar116;
              local_1080._20_4_ = fVar116;
              local_1080._24_4_ = fVar116;
              local_1080._28_4_ = fVar116;
              local_10c0[0] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[1] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[2] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[3] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              local_10c0[4] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[5] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[6] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[7] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              local_10c0[8] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[9] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[10] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[0xb] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              local_10c0[0xc] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[0xd] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[0xe] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[0xf] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              local_10c0[0x10] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[0x11] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              local_10c0[0x14] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[0x15] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              local_10c0[0x18] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[0x19] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              local_10c0[0x1c] = (RTCHitN)SUB41(fVar106,0);
              local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar106 >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
              uStack_105c = local_1060;
              uStack_1058 = local_1060;
              uStack_1054 = local_1060;
              uStack_1050 = local_1060;
              uStack_104c = local_1060;
              uStack_1048 = local_1060;
              uStack_1044 = local_1060;
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              uStack_101c = local_1020;
              uStack_1018 = local_1020;
              uStack_1014 = local_1020;
              uStack_1010 = local_1020;
              uStack_100c = local_1020;
              uStack_1008 = local_1020;
              uStack_1004 = local_1020;
              local_1000 = auStack_ff0;
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              *(float *)(ray + k * 4 + 0x100) = local_11a0[uVar74 - 8];
              local_15e0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar73 & 0xf) << 4));
              local_15d0 = *(undefined1 (*) [16])
                            (mm_lookupmask_ps + (long)((int)uVar73 >> 4) * 0x10);
              local_15b0.valid = (int *)local_15e0;
              local_15b0.geometryUserPtr = pGVar92->userPtr;
              local_15b0.context = context->user;
              local_15b0.hit = local_10c0;
              local_15b0.N = 8;
              local_15b0.ray = (RTCRayN *)ray;
              if (pGVar92->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                local_1580._0_8_ = pGVar92;
                auVar110 = ZEXT1632(auVar178._0_16_);
                (*pGVar92->intersectionFilterN)(&local_15b0);
                auVar175 = ZEXT3264(auVar175._0_32_);
                auVar102 = ZEXT3264(auVar102._0_32_);
                auVar110 = vcmpps_avx(auVar110,auVar110,0xf);
                auVar178 = ZEXT3264(auVar110);
                pGVar92 = (Geometry *)local_1580._0_8_;
              }
              auVar97 = vpcmpeqd_avx(local_15e0,ZEXT816(0) << 0x40);
              auVar108 = vpcmpeqd_avx(local_15d0,ZEXT816(0) << 0x40);
              auVar130._16_16_ = auVar108;
              auVar130._0_16_ = auVar97;
              auVar110 = auVar178._0_32_ & ~auVar130;
              if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar110 >> 0x7f,0) == '\0') &&
                    (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar110 >> 0xbf,0) == '\0') &&
                  (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar110[0x1f]) {
                auVar100._0_4_ = auVar97._0_4_ ^ auVar178._0_4_;
                auVar100._4_4_ = auVar97._4_4_ ^ auVar178._4_4_;
                auVar100._8_4_ = auVar97._8_4_ ^ auVar178._8_4_;
                auVar100._12_4_ = auVar97._12_4_ ^ auVar178._12_4_;
                auVar100._16_4_ = auVar108._0_4_ ^ auVar178._16_4_;
                auVar100._20_4_ = auVar108._4_4_ ^ auVar178._20_4_;
                auVar100._24_4_ = auVar108._8_4_ ^ auVar178._24_4_;
                auVar100._28_4_ = auVar108._12_4_ ^ auVar178._28_4_;
              }
              else {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar92->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar110 = ZEXT1632(auVar178._0_16_);
                  (*p_Var11)(&local_15b0);
                  auVar175 = ZEXT3264(auVar175._0_32_);
                  auVar102 = ZEXT3264(auVar102._0_32_);
                  auVar110 = vcmpps_avx(auVar110,auVar110,0xf);
                  auVar178 = ZEXT3264(auVar110);
                }
                auVar97 = vpcmpeqd_avx(local_15e0,ZEXT816(0) << 0x40);
                auVar108 = vpcmpeqd_avx(local_15d0,ZEXT816(0) << 0x40);
                auVar114._16_16_ = auVar108;
                auVar114._0_16_ = auVar97;
                auVar100._0_4_ = auVar97._0_4_ ^ auVar178._0_4_;
                auVar100._4_4_ = auVar97._4_4_ ^ auVar178._4_4_;
                auVar100._8_4_ = auVar97._8_4_ ^ auVar178._8_4_;
                auVar100._12_4_ = auVar97._12_4_ ^ auVar178._12_4_;
                auVar100._16_4_ = auVar108._0_4_ ^ auVar178._16_4_;
                auVar100._20_4_ = auVar108._4_4_ ^ auVar178._20_4_;
                auVar100._24_4_ = auVar108._8_4_ ^ auVar178._24_4_;
                auVar100._28_4_ = auVar108._12_4_ ^ auVar178._28_4_;
                auVar110 = auVar178._0_32_ & ~auVar114;
                if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar110 >> 0x7f,0) != '\0') ||
                      (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar110 >> 0xbf,0) != '\0') ||
                    (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar110[0x1f] < '\0') {
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])local_15b0.hit);
                  *(undefined1 (*) [32])(local_15b0.ray + 0x180) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0x20));
                  *(undefined1 (*) [32])(local_15b0.ray + 0x1a0) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0x40));
                  *(undefined1 (*) [32])(local_15b0.ray + 0x1c0) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0x60));
                  *(undefined1 (*) [32])(local_15b0.ray + 0x1e0) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0x80));
                  *(undefined1 (*) [32])(local_15b0.ray + 0x200) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0xa0));
                  *(undefined1 (*) [32])(local_15b0.ray + 0x220) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0xc0));
                  *(undefined1 (*) [32])(local_15b0.ray + 0x240) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0xe0));
                  *(undefined1 (*) [32])(local_15b0.ray + 0x260) = auVar110;
                  auVar110 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(local_15b0.hit + 0x100))
                  ;
                  *(undefined1 (*) [32])(local_15b0.ray + 0x280) = auVar110;
                }
              }
              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar100 >> 0x7f,0) == '\0') &&
                    (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar100 >> 0xbf,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar100[0x1f]) {
                *(int *)(ray + k * 4 + 0x100) = auVar175._0_4_;
              }
              else {
                auVar175 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_1560 + uVar74 * 4) = 0;
              auVar97 = vshufps_avx(auVar175._0_16_,auVar175._0_16_,0);
              auVar101._16_16_ = auVar97;
              auVar101._0_16_ = auVar97;
              auVar110 = vcmpps_avx(auVar102._0_32_,auVar101,2);
              local_1560 = vandps_avx(auVar110,local_1560);
            }
            if ((((((((local_1560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1560 >> 0x7f,0) == '\0') &&
                  (local_1560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1560 >> 0xbf,0) == '\0') &&
                (local_1560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1560[0x1f]) goto LAB_00f8c75c;
            auVar113._8_4_ = 0x7f800000;
            auVar113._0_8_ = 0x7f8000007f800000;
            auVar113._12_4_ = 0x7f800000;
            auVar113._16_4_ = 0x7f800000;
            auVar113._20_4_ = 0x7f800000;
            auVar113._24_4_ = 0x7f800000;
            auVar113._28_4_ = 0x7f800000;
            auVar110 = vblendvps_avx(auVar113,auVar102._0_32_,local_1560);
            auVar146 = vshufps_avx(auVar110,auVar110,0xb1);
            auVar146 = vminps_avx(auVar110,auVar146);
            auVar28 = vshufpd_avx(auVar146,auVar146,5);
            auVar146 = vminps_avx(auVar146,auVar28);
            auVar28 = vperm2f128_avx(auVar146,auVar146,1);
            auVar146 = vminps_avx(auVar146,auVar28);
            auVar146 = vcmpps_avx(auVar110,auVar146,0);
            auVar28 = local_1560 & auVar146;
            auVar110 = local_1560;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar110 = vandps_avx(auVar146,local_1560);
            }
            uVar66 = vmovmskps_avx(auVar110);
            uVar70 = 0;
            if (uVar66 != 0) {
              for (; (uVar66 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            goto LAB_00f8c2a2;
          }
        }
      }
LAB_00f8c75c:
      auVar178 = ZEXT1664(local_1350);
      auVar182 = ZEXT1664(local_1360);
      auVar200 = ZEXT1664(local_1370);
      auVar208 = ZEXT1664(local_1380);
      auVar211 = ZEXT1664(local_1390);
      auVar221 = ZEXT1664(local_13a0);
      auVar237 = ZEXT1664(local_13b0);
      auVar246 = ZEXT1664(local_13c0);
      auVar248 = ZEXT1664(local_13d0);
      auVar175 = ZEXT1664(local_1530);
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar102 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }